

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::true_matcher>>
          (string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,matcher_wrapper<boost::xpressive::detail::true_matcher> *next)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar1 = (state->cur_)._M_current;
  pcVar3 = *(char **)this;
  pcVar2 = *(char **)(this + 0x20);
  pcVar4 = pcVar1;
  do {
    if (pcVar3 == pcVar2) {
LAB_00126e2f:
      return pcVar3 == pcVar2;
    }
    if (pcVar4 == (state->end_)._M_current) {
      state->found_partial_match_ = true;
LAB_00126e2c:
      (state->cur_)._M_current = pcVar1;
      goto LAB_00126e2f;
    }
    if (*pcVar4 != *pcVar3) goto LAB_00126e2c;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar4 + 1;
    (state->cur_)._M_current = pcVar4;
  } while( true );
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            BidiIter const tmp = state.cur_;
            char_type const *begin = detail::data_begin(this->str_);
            for(; begin != this->end_; ++begin, ++state.cur_)
            {
                if(state.eos() ||
                    (detail::translate(*state.cur_, traits_cast<Traits>(state), icase_type()) != *begin))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            if(next.match(state))
            {
                return true;
            }

            state.cur_ = tmp;
            return false;
        }